

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O3

Oop __thiscall
Lodtalk::ASTInterpreter::visitMessageSendNode(ASTInterpreter *this,MessageSendNode *node)

{
  pointer ppNVar1;
  InterpreterProxy *pIVar2;
  Node *pNVar3;
  vector<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_> *pvVar4;
  vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *pvVar5;
  Oop OVar6;
  pointer ppMVar7;
  uint uVar8;
  Node **arg;
  pointer ppNVar9;
  pointer ppMVar10;
  MessageSendNode *this_00;
  vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *__range2;
  
  pNVar3 = AST::MessageSendNode::getReceiver(node);
  (*pNVar3->_vptr_Node[2])(pNVar3,this);
  pvVar4 = AST::MessageSendNode::getChainedMessages(node);
  ppMVar10 = (pvVar4->
             super__Vector_base<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  ppMVar7 = (pvVar4->
            super__Vector_base<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (((ulong)((long)ppMVar7 - (long)ppMVar10) >> 0x22 & 1) == 0) {
    uVar8 = 0xffffffff;
    do {
      if ((int)uVar8 < 0) {
        this_00 = node;
        if (uVar8 != 0xffffffff) goto LAB_001368eb;
      }
      else {
        this_00 = ppMVar10[uVar8];
LAB_001368eb:
        (*this->interpreter->_vptr_InterpreterProxy[6])();
        ppMVar10 = (pvVar4->
                   super__Vector_base<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        ppMVar7 = (pvVar4->
                  super__Vector_base<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar8 = uVar8 + 1;
      if (uVar8 != (uint)((ulong)((long)ppMVar7 - (long)ppMVar10) >> 3)) {
        (*this->interpreter->_vptr_InterpreterProxy[8])();
      }
      pvVar5 = AST::MessageSendNode::getArguments(this_00);
      ppNVar1 = (pvVar5->
                super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppNVar9 = (pvVar5->
                     super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>
                     )._M_impl.super__Vector_impl_data._M_start; ppNVar9 != ppNVar1;
          ppNVar9 = ppNVar9 + 1) {
        (*(*ppNVar9)->_vptr_Node[2])(*ppNVar9,this);
      }
      pIVar2 = this->interpreter;
      OVar6 = AST::MessageSendNode::getSelectorOop(this_00);
      (*pIVar2->_vptr_InterpreterProxy[0x23])
                (pIVar2,OVar6.field_0,
                 (ulong)((long)(pvVar5->
                               super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pvVar5->
                              super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>
                              )._M_impl.super__Vector_impl_data._M_start) >> 3);
      ppMVar10 = (pvVar4->
                 super__Vector_base<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      ppMVar7 = (pvVar4->
                super__Vector_base<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    } while ((int)uVar8 < (int)((ulong)((long)ppMVar7 - (long)ppMVar10) >> 3));
  }
  return (Oop)&NilObject;
}

Assistant:

Oop ASTInterpreter::visitMessageSendNode(MessageSendNode *node)
{
	// Evaluate the receiver.
	node->getReceiver()->acceptVisitor(this);
	auto &chained = node->getChainedMessages();

	// Send each message in the chain
	for(int i = -1; i < (int)chained.size(); ++i)
	{
		auto message = i < 0 ? node : chained[i];
        // Duplicate the receiver for the next chains
        if(i != -1)
            interpreter->popOop();
        if(i + 1 != (int)chained.size())
            interpreter->duplicateStackTop();

		// Evaluate the arguments.
		auto &arguments = message->getArguments();
		for(auto &arg : arguments)
            arg->acceptVisitor(this);

        interpreter->sendMessageWithSelector(message->getSelectorOop(), (int)arguments.size());
	}

	return Oop();
}